

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsEmpty(void)

{
  initializer_list<int> __l;
  allocator_type local_39;
  int local_38 [6];
  vector<int,_std::allocator<int>_> v;
  
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[2] = 3;
  local_38[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&v.super__Vector_base<int,_std::allocator<int>_>,
             __l,&local_39);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int testSpanTestsEmpty()
{
    // test 0 length but valud ptr
    std::vector<int> v = {1, 2, 3, 4};
    Span<int> span(v.data(), 0);
    ML_ASSERT(span.IsEmpty());
    ML_ASSERT_EQ(span.Size(), size_t(0));
    ML_ASSERT_EQ(span.Data(), nullptr);

    return 0;
}